

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall Memory::Recycler::VerifyMark(Recycler *this,void *objectAddress,void *target)

{
  int iVar1;
  undefined4 extraout_var;
  HeapBlock *local_38;
  HeapBlock *heapBlock;
  void *realAddress;
  void *target_local;
  void *objectAddress_local;
  Recycler *this_local;
  
  if ((this->enableScanInteriorPointers & 1U) == 0) {
    local_38 = FindHeapBlock(this,target);
    heapBlock = (HeapBlock *)target;
    if (local_38 == (HeapBlock *)0x0) {
      return false;
    }
  }
  else {
    local_38 = HeapBlockMap64::GetHeapBlock(&this->heapBlockMap,target);
    if (local_38 == (HeapBlock *)0x0) {
      return false;
    }
    iVar1 = (*local_38->_vptr_HeapBlock[8])(local_38,target);
    heapBlock = (HeapBlock *)CONCAT44(extraout_var,iVar1);
    if (heapBlock == (HeapBlock *)0x0) {
      return false;
    }
  }
  iVar1 = (*local_38->_vptr_HeapBlock[0xd])(local_38,objectAddress,heapBlock);
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool
Recycler::VerifyMark(void * objectAddress, void * target)
{
    void * realAddress;
    HeapBlock * heapBlock;
    if (this->enableScanInteriorPointers)
    {
        heapBlock = heapBlockMap.GetHeapBlock(target);
        if (heapBlock == nullptr)
        {
            return false;
        }
        realAddress = heapBlock->GetRealAddressFromInterior(target);
        if (realAddress == nullptr)
        {
            return false;
        }
    }
    else
    {
        heapBlock = this->FindHeapBlock(target);
        if (heapBlock == nullptr)
        {
            return false;
        }
        realAddress = target;
    }
    return heapBlock->VerifyMark(objectAddress, realAddress);
}